

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Error __thiscall llvm::AppleAcceleratorTable::extract(AppleAcceleratorTable *this)

{
  DataExtractor *this_00;
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  char *Msg;
  long in_RSI;
  bool bVar4;
  error_code EC;
  uint64_t local_40;
  uint64_t Offset;
  
  local_40 = 0;
  if (*(ulong *)(in_RSI + 0x10) < 0x15) {
    Msg = (char *)std::_V2::generic_category();
  }
  else {
    this_00 = (DataExtractor *)(in_RSI + 8);
    uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x48) = uVar3;
    uVar1 = DataExtractor::getU16(this_00,&local_40,(Error *)0x0);
    *(uint16_t *)(in_RSI + 0x4c) = uVar1;
    uVar1 = DataExtractor::getU16(this_00,&local_40,(Error *)0x0);
    *(uint16_t *)(in_RSI + 0x4e) = uVar1;
    uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x50) = uVar3;
    uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x54) = uVar3;
    uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x58) = uVar3;
    if ((ulong)(uint)(*(int *)(in_RSI + 0x54) << 3) +
        (ulong)(uint)(*(int *)(in_RSI + 0x50) << 2) + (ulong)uVar3 + 0x13 <
        *(ulong *)(in_RSI + 0x10)) {
      uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
      *(ulong *)(in_RSI + 0x60) = (ulong)uVar3;
      uVar3 = DataExtractor::getU32(this_00,&local_40,(Error *)0x0);
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        uVar1 = DataExtractor::getU16(this_00,&local_40,(Error *)0x0);
        uVar2 = DataExtractor::getU16(this_00,&local_40,(Error *)0x0);
        Offset._4_4_ = CONCAT22(uVar2,uVar1);
        SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>::push_back
                  ((SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *)
                   (in_RSI + 0x68),(pair<unsigned_short,_llvm::dwarf::Form> *)((long)&Offset + 4));
      }
      *(undefined1 *)(in_RSI + 0x88) = 1;
      (this->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable = (_func_int **)0x1;
      return (Error)(ErrorInfoBase *)this;
    }
    Msg = (char *)std::_V2::generic_category();
  }
  EC._M_cat = (error_category *)0x54;
  EC._0_8_ = this;
  createStringError(EC,Msg);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error AppleAcceleratorTable::extract() {
  uint64_t Offset = 0;

  // Check that we can at least read the header.
  if (!AccelSection.isValidOffset(offsetof(Header, HeaderDataLength) + 4))
    return createStringError(errc::illegal_byte_sequence,
                             "Section too small: cannot read header.");

  Hdr.Magic = AccelSection.getU32(&Offset);
  Hdr.Version = AccelSection.getU16(&Offset);
  Hdr.HashFunction = AccelSection.getU16(&Offset);
  Hdr.BucketCount = AccelSection.getU32(&Offset);
  Hdr.HashCount = AccelSection.getU32(&Offset);
  Hdr.HeaderDataLength = AccelSection.getU32(&Offset);

  // Check that we can read all the hashes and offsets from the
  // section (see SourceLevelDebugging.rst for the structure of the index).
  // We need to substract one because we're checking for an *offset* which is
  // equal to the size for an empty table and hence pointer after the section.
  if (!AccelSection.isValidOffset(sizeof(Hdr) + Hdr.HeaderDataLength +
                                  Hdr.BucketCount * 4 + Hdr.HashCount * 8 - 1))
    return createStringError(
        errc::illegal_byte_sequence,
        "Section too small: cannot read buckets and hashes.");

  HdrData.DIEOffsetBase = AccelSection.getU32(&Offset);
  uint32_t NumAtoms = AccelSection.getU32(&Offset);

  for (unsigned i = 0; i < NumAtoms; ++i) {
    uint16_t AtomType = AccelSection.getU16(&Offset);
    auto AtomForm = static_cast<dwarf::Form>(AccelSection.getU16(&Offset));
    HdrData.Atoms.push_back(std::make_pair(AtomType, AtomForm));
  }

  IsValid = true;
  return Error::success();
}